

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O0

u_int sbfTport_topicWeight(sbfTport tport,sbfTopic topic)

{
  int iVar1;
  u_int *puVar2;
  char *__string;
  sbfTopic in_RSI;
  long in_RDI;
  u_int i;
  sbfTportWeight *w;
  uint local_24;
  
  local_24 = 0;
  while( true ) {
    if (*(uint *)(in_RDI + 0x160) <= local_24) {
      return 1;
    }
    puVar2 = (u_int *)(*(long *)(in_RDI + 0x168) + (ulong)local_24 * 0x48);
    __string = sbfTopic_getTopic(in_RSI);
    iVar1 = regexec((regex_t *)(puVar2 + 2),__string,0,(regmatch_t *)0x0,0);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return *puVar2;
}

Assistant:

u_int
sbfTport_topicWeight (sbfTport tport, sbfTopic topic)
{
    sbfTportWeight* w;
    u_int           i;

    for (i = 0; i < tport->mWeightsListSize; i++)
    {
        w = &tport->mWeightsList[i];
        if (regexec (&w->mPattern, sbfTopic_getTopic (topic), 0, NULL, 0) == 0)
            return w->mWeight;
    }
    return 1;
}